

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
Geometry<unsigned_long*,unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          unsigned_long *it,CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  undefined8 *puVar1;
  CoordinateOrder CVar2;
  unsigned_long uVar3;
  Geometry<std::allocator<unsigned_long>> GVar4;
  unsigned_long *puVar5;
  runtime_error *this_00;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  lVar6 = (long)end - (long)begin >> 3;
  puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,lVar6 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar5;
  lVar7 = (long)end - (long)begin;
  puVar1 = (undefined8 *)((long)puVar5 + lVar7);
  *(undefined8 **)(this + 0x10) = puVar1;
  *(long *)(this + 0x18) = lVar7 + (long)puVar1;
  *(long *)(this + 0x20) = lVar6;
  *(undefined8 *)(this + 0x28) = 1;
  CVar2 = *internalCoordinateOrder;
  *(CoordinateOrder *)(this + 0x30) = CVar2;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (lVar7 != 0) {
    uVar10 = 0;
    do {
      uVar3 = begin[uVar10];
      puVar5[uVar10] = uVar3;
      *(unsigned_long *)(this + 0x28) = uVar3 * *(long *)(this + 0x28);
      if (*(ulong *)(this + 0x20) <= uVar10) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_001270f9;
      }
      *(unsigned_long *)((long)puVar5 + uVar10 * 8 + (long)end * 2 + (long)begin * -2) = it[uVar10];
      uVar10 = uVar10 + 1;
      uVar8 = *(ulong *)(this + 0x20);
    } while (uVar10 < uVar8);
    if (uVar8 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_001270f9:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (CVar2 == FirstMajorOrder) {
      puVar1[uVar8 - 1] = 1;
      if (uVar8 != 1) {
        lVar6 = 1;
        do {
          lVar6 = lVar6 * puVar5[uVar8 - 1];
          *(long *)((long)puVar5 + uVar8 * 8 + lVar7 + -0x10) = lVar6;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 1);
      }
    }
    else {
      *puVar1 = 1;
      if (uVar8 != 1) {
        lVar6 = uVar8 - 1;
        lVar9 = 1;
        do {
          lVar9 = lVar9 * *puVar5;
          *(long *)((long)puVar5 + lVar7 + 8) = lVar9;
          puVar5 = puVar5 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
    }
    GVar4 = (Geometry<std::allocator<unsigned_long>>)0x1;
    if (*(long *)(this + 0x20) != 0) {
      lVar6 = 0;
      do {
        if (puVar1[lVar6] != *(long *)(lVar7 + (long)puVar1 + lVar6 * 8)) {
          GVar4 = (Geometry<std::allocator<unsigned_long>>)0x0;
          break;
        }
        lVar6 = lVar6 + 1;
      } while (*(long *)(this + 0x20) != lVar6);
    }
    this[0x34] = GVar4;
  }
  return;
}

Assistant:

inline
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    StrideIterator it,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension() != 0) {
        for(std::size_t j=0; j<dimension(); ++j, ++begin, ++it) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
            strides(j) = *it;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
        updateSimplicity();
    }
}